

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void qDeleteAll<QList<DomResource*>::const_iterator>(const_iterator begin,const_iterator end)

{
  DomResource *pDVar1;
  Data *pDVar2;
  
  if (begin.i != end.i) {
    do {
      pDVar1 = *begin.i;
      if (pDVar1 != (DomResource *)0x0) {
        pDVar2 = (pDVar1->m_attr_location).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pDVar1->m_attr_location).d.d)->super_QArrayData,2,0x10);
          }
        }
        operator_delete(pDVar1,0x20);
      }
      begin.i = begin.i + 1;
    } while (begin.i != end.i);
  }
  return;
}

Assistant:

inline constexpr bool operator!=(const_iterator o) const { return i != o.i; }